

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void emit_D3D_opcode_ds(Context *ctx,char *opcode)

{
  char cVar1;
  long lVar2;
  int i;
  size_t sVar3;
  long lVar4;
  size_t in_RDX;
  char *pcVar5;
  char cVar6;
  undefined8 uStack_a0;
  char local_98 [8];
  char dst [64];
  char src0 [64];
  
  uStack_a0 = 0x11d7df;
  make_D3D_destarg_string(ctx,local_98,in_RDX);
  uStack_a0 = 0x11d7f7;
  make_D3D_srcarg_string_in_buf(ctx,ctx->source_args,dst + 0x38,0x40);
  uStack_a0 = 0x11d7ff;
  sVar3 = strlen(opcode);
  lVar2 = -(sVar3 + 0x10 & 0xfffffffffffffff0);
  lVar4 = 0;
  do {
    cVar1 = opcode[lVar4];
    cVar6 = cVar1 + ' ';
    if (0x19 < (byte)(cVar1 + 0xbfU)) {
      cVar6 = cVar1;
    }
    (local_98 + lVar2)[lVar4] = cVar6;
    lVar4 = lVar4 + 1;
  } while (cVar1 != '\0');
  pcVar5 = "+";
  if (ctx->coissue == 0) {
    pcVar5 = "";
  }
  *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x11d868;
  output_line(ctx,"%s%s%s, %s",pcVar5,local_98 + lVar2,local_98,dst + 0x38);
  return;
}

Assistant:

static void emit_D3D_opcode_ds(Context *ctx, const char *opcode)
{
    char dst[64]; make_D3D_destarg_string(ctx, dst, sizeof (dst));
    char src0[64]; make_D3D_srcarg_string(ctx, 0, src0, sizeof (src0));
    opcode = lowercase((char *) alloca(strlen(opcode) + 1), opcode);
    output_line(ctx, "%s%s%s, %s", ctx->coissue ? "+" : "", opcode, dst, src0);
}